

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_options<wchar_t>::basic_json_options(basic_json_options<wchar_t> *this)

{
  basic_json_decode_options<wchar_t> *in_RDI;
  basic_json_encode_options<wchar_t> *unaff_retaddr;
  void **in_stack_ffffffffffffffd8;
  basic_json_decode_options<wchar_t> *vtt;
  
  vtt = in_RDI;
  basic_json_options_common<wchar_t>::basic_json_options_common
            ((basic_json_options_common<wchar_t> *)in_RDI);
  basic_json_decode_options<wchar_t>::basic_json_decode_options(in_RDI,in_stack_ffffffffffffffd8);
  basic_json_encode_options<wchar_t>::basic_json_encode_options
            (unaff_retaddr,&vtt->_vptr_basic_json_decode_options);
  in_RDI->_vptr_basic_json_decode_options = (_func_int **)0x133dd60;
  *(undefined8 *)&in_RDI->field_0x70 = 0x133ddb0;
  *(undefined8 *)&in_RDI->field_0x30 = 0x133dd88;
  return;
}

Assistant:

basic_json_options() = default;